

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O1

void __thiscall
Assimp::Ogre::Bone::CalculateWorldMatrixAndDefaultPose(Bone *this,Skeleton *skeleton)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  uint16_t *puVar20;
  aiMatrix4x4t<float> *paVar21;
  pointer ppBVar22;
  runtime_error *this_00;
  Bone *pBVar23;
  uint16_t *puVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  string local_1c8 [32];
  aiMatrix4x4t<float> local_1a8 [5];
  
  if ((this->parentId == -1) || (this->parent == (Bone *)0x0)) {
    fVar36 = (this->rotation).y;
    fVar25 = (this->rotation).z;
    fVar1 = (this->rotation).x;
    fVar29 = fVar36 * fVar36 + fVar25 * fVar25;
    fVar2 = (this->rotation).w;
    fVar30 = fVar1 * fVar36 - fVar25 * fVar2;
    fVar31 = fVar1 * fVar25 + fVar36 * fVar2;
    fVar27 = fVar25 * fVar2 + fVar1 * fVar36;
    fVar32 = fVar25 * fVar25 + fVar1 * fVar1;
    fVar33 = fVar36 * fVar25 - fVar1 * fVar2;
    fVar26 = fVar1 * fVar25 - fVar36 * fVar2;
    fVar25 = fVar1 * fVar2 + fVar36 * fVar25;
    fVar36 = fVar1 * fVar1 + fVar36 * fVar36;
    local_1a8[0].a3 = (this->scale).x;
    local_1a8[0].a1 = (1.0 - (fVar29 + fVar29)) * local_1a8[0].a3;
    local_1a8[0].a2 = (fVar30 + fVar30) * local_1a8[0].a3;
    local_1a8[0].a3 = (fVar31 + fVar31) * local_1a8[0].a3;
    local_1a8[0].a4 = (this->position).x;
    local_1a8[0].b3 = (this->scale).y;
    local_1a8[0].b1 = (fVar27 + fVar27) * local_1a8[0].b3;
    local_1a8[0].b2 = (1.0 - (fVar32 + fVar32)) * local_1a8[0].b3;
    local_1a8[0].b3 = (fVar33 + fVar33) * local_1a8[0].b3;
    local_1a8[0].b4 = (this->position).y;
    local_1a8[0].c3 = (this->scale).z;
    local_1a8[0].c1 = (fVar26 + fVar26) * local_1a8[0].c3;
    local_1a8[0].c2 = (fVar25 + fVar25) * local_1a8[0].c3;
    local_1a8[0].c3 = (1.0 - (fVar36 + fVar36)) * local_1a8[0].c3;
    local_1a8[0].c4 = (this->position).z;
    local_1a8[0].d1 = 0.0;
    local_1a8[0].d2 = 0.0;
    local_1a8[0].d3 = 0.0;
    local_1a8[0].d4 = 1.0;
    paVar21 = aiMatrix4x4t<float>::Inverse(local_1a8);
    fVar36 = paVar21->a2;
    fVar25 = paVar21->a3;
    fVar1 = paVar21->a4;
    fVar2 = paVar21->b1;
    fVar26 = paVar21->b2;
    fVar27 = paVar21->b3;
    fVar29 = paVar21->b4;
    fVar30 = paVar21->c1;
    fVar31 = paVar21->c2;
    fVar32 = paVar21->c3;
    fVar33 = paVar21->c4;
    fVar28 = paVar21->d1;
    fVar34 = paVar21->d2;
    fVar35 = paVar21->d3;
    fVar37 = paVar21->d4;
    (this->worldMatrix).a1 = paVar21->a1;
    (this->worldMatrix).a2 = fVar36;
    (this->worldMatrix).a3 = fVar25;
    (this->worldMatrix).a4 = fVar1;
    (this->worldMatrix).b1 = fVar2;
    (this->worldMatrix).b2 = fVar26;
    (this->worldMatrix).b3 = fVar27;
    (this->worldMatrix).b4 = fVar29;
    (this->worldMatrix).c1 = fVar30;
    (this->worldMatrix).c2 = fVar31;
    (this->worldMatrix).c3 = fVar32;
    (this->worldMatrix).c4 = fVar33;
    (this->worldMatrix).d1 = fVar28;
    (this->worldMatrix).d2 = fVar34;
    (this->worldMatrix).d3 = fVar35;
    (this->worldMatrix).d4 = fVar37;
  }
  else {
    fVar36 = (this->rotation).y;
    fVar25 = (this->rotation).z;
    fVar1 = (this->rotation).x;
    fVar29 = fVar36 * fVar36 + fVar25 * fVar25;
    fVar2 = (this->rotation).w;
    fVar30 = fVar1 * fVar36 - fVar25 * fVar2;
    fVar31 = fVar1 * fVar25 + fVar36 * fVar2;
    fVar27 = fVar25 * fVar2 + fVar1 * fVar36;
    fVar32 = fVar25 * fVar25 + fVar1 * fVar1;
    fVar33 = fVar36 * fVar25 - fVar1 * fVar2;
    fVar26 = fVar1 * fVar25 - fVar36 * fVar2;
    fVar25 = fVar1 * fVar2 + fVar36 * fVar25;
    fVar36 = fVar1 * fVar1 + fVar36 * fVar36;
    local_1a8[0].a3 = (this->scale).x;
    local_1a8[0].a1 = (1.0 - (fVar29 + fVar29)) * local_1a8[0].a3;
    local_1a8[0].a2 = (fVar30 + fVar30) * local_1a8[0].a3;
    local_1a8[0].a3 = (fVar31 + fVar31) * local_1a8[0].a3;
    local_1a8[0].a4 = (this->position).x;
    local_1a8[0].b3 = (this->scale).y;
    local_1a8[0].b1 = (fVar27 + fVar27) * local_1a8[0].b3;
    local_1a8[0].b2 = (1.0 - (fVar32 + fVar32)) * local_1a8[0].b3;
    local_1a8[0].b3 = (fVar33 + fVar33) * local_1a8[0].b3;
    local_1a8[0].b4 = (this->position).y;
    local_1a8[0].c3 = (this->scale).z;
    local_1a8[0].c1 = (fVar26 + fVar26) * local_1a8[0].c3;
    local_1a8[0].c2 = (fVar25 + fVar25) * local_1a8[0].c3;
    local_1a8[0].c3 = (1.0 - (fVar36 + fVar36)) * local_1a8[0].c3;
    local_1a8[0].c4 = (this->position).z;
    local_1a8[0].d1 = 0.0;
    local_1a8[0].d2 = 0.0;
    local_1a8[0].d3 = 0.0;
    local_1a8[0].d4 = 1.0;
    paVar21 = aiMatrix4x4t<float>::Inverse(local_1a8);
    pBVar23 = this->parent;
    fVar36 = paVar21->a1;
    fVar25 = paVar21->a2;
    fVar1 = paVar21->a3;
    fVar2 = paVar21->a4;
    fVar26 = (pBVar23->worldMatrix).b1;
    fVar27 = (pBVar23->worldMatrix).a1;
    fVar29 = (pBVar23->worldMatrix).a2;
    fVar30 = (pBVar23->worldMatrix).c1;
    fVar31 = (pBVar23->worldMatrix).d1;
    fVar32 = (pBVar23->worldMatrix).b2;
    fVar33 = (pBVar23->worldMatrix).c2;
    fVar28 = (pBVar23->worldMatrix).d2;
    fVar34 = (pBVar23->worldMatrix).b3;
    fVar35 = (pBVar23->worldMatrix).a3;
    fVar37 = (pBVar23->worldMatrix).c3;
    fVar3 = (pBVar23->worldMatrix).d3;
    fVar4 = (pBVar23->worldMatrix).b4;
    fVar5 = (pBVar23->worldMatrix).a4;
    fVar6 = (pBVar23->worldMatrix).c4;
    fVar7 = (pBVar23->worldMatrix).d4;
    fVar8 = paVar21->b2;
    fVar9 = paVar21->b1;
    fVar10 = paVar21->b3;
    fVar11 = paVar21->b4;
    fVar12 = paVar21->c2;
    fVar13 = paVar21->c1;
    fVar14 = paVar21->c3;
    fVar15 = paVar21->c4;
    fVar16 = paVar21->d2;
    fVar17 = paVar21->d1;
    fVar18 = paVar21->d3;
    fVar19 = paVar21->d4;
    (this->worldMatrix).a1 = fVar31 * fVar2 + fVar30 * fVar1 + fVar27 * fVar36 + fVar25 * fVar26;
    (this->worldMatrix).a2 = fVar28 * fVar2 + fVar33 * fVar1 + fVar29 * fVar36 + fVar25 * fVar32;
    (this->worldMatrix).a3 = fVar3 * fVar2 + fVar37 * fVar1 + fVar35 * fVar36 + fVar25 * fVar34;
    (this->worldMatrix).a4 = fVar2 * fVar7 + fVar1 * fVar6 + fVar36 * fVar5 + fVar25 * fVar4;
    (this->worldMatrix).b1 = fVar31 * fVar11 + fVar30 * fVar10 + fVar27 * fVar9 + fVar8 * fVar26;
    (this->worldMatrix).b2 = fVar28 * fVar11 + fVar33 * fVar10 + fVar29 * fVar9 + fVar8 * fVar32;
    (this->worldMatrix).b3 = fVar3 * fVar11 + fVar37 * fVar10 + fVar35 * fVar9 + fVar8 * fVar34;
    (this->worldMatrix).b4 = fVar11 * fVar7 + fVar10 * fVar6 + fVar9 * fVar5 + fVar8 * fVar4;
    (this->worldMatrix).c1 = fVar31 * fVar15 + fVar30 * fVar14 + fVar27 * fVar13 + fVar12 * fVar26;
    (this->worldMatrix).c2 = fVar28 * fVar15 + fVar33 * fVar14 + fVar29 * fVar13 + fVar12 * fVar32;
    (this->worldMatrix).c3 = fVar3 * fVar15 + fVar37 * fVar14 + fVar35 * fVar13 + fVar12 * fVar34;
    (this->worldMatrix).c4 = fVar15 * fVar7 + fVar14 * fVar6 + fVar13 * fVar5 + fVar12 * fVar4;
    (this->worldMatrix).d1 = fVar31 * fVar19 + fVar30 * fVar18 + fVar27 * fVar17 + fVar26 * fVar16;
    (this->worldMatrix).d2 = fVar28 * fVar19 + fVar33 * fVar18 + fVar29 * fVar17 + fVar32 * fVar16;
    (this->worldMatrix).d3 = fVar3 * fVar19 + fVar37 * fVar18 + fVar35 * fVar17 + fVar34 * fVar16;
    (this->worldMatrix).d4 = fVar7 * fVar19 + fVar6 * fVar18 + fVar5 * fVar17 + fVar16 * fVar4;
  }
  fVar36 = (this->rotation).y;
  fVar25 = (this->rotation).z;
  fVar1 = (this->rotation).x;
  fVar32 = fVar36 * fVar36 + fVar25 * fVar25;
  fVar2 = (this->rotation).w;
  fVar33 = fVar1 * fVar36 - fVar25 * fVar2;
  fVar28 = fVar1 * fVar25 + fVar36 * fVar2;
  fVar30 = fVar25 * fVar2 + fVar1 * fVar36;
  fVar34 = fVar25 * fVar25 + fVar1 * fVar1;
  fVar35 = fVar36 * fVar25 - fVar1 * fVar2;
  fVar31 = fVar1 * fVar25 - fVar36 * fVar2;
  fVar29 = fVar1 * fVar2 + fVar36 * fVar25;
  fVar37 = fVar1 * fVar1 + fVar36 * fVar36;
  fVar36 = (this->scale).x;
  fVar25 = (this->scale).y;
  fVar1 = (this->position).x;
  fVar2 = (this->position).y;
  fVar26 = (this->scale).z;
  fVar27 = (this->position).z;
  (this->defaultPose).a1 = (1.0 - (fVar32 + fVar32)) * fVar36;
  (this->defaultPose).a2 = (fVar33 + fVar33) * fVar36;
  (this->defaultPose).a3 = (fVar28 + fVar28) * fVar36;
  (this->defaultPose).a4 = fVar1;
  (this->defaultPose).b1 = (fVar30 + fVar30) * fVar25;
  (this->defaultPose).b2 = (1.0 - (fVar34 + fVar34)) * fVar25;
  (this->defaultPose).b3 = (fVar35 + fVar35) * fVar25;
  (this->defaultPose).b4 = fVar2;
  (this->defaultPose).c1 = (fVar31 + fVar31) * fVar26;
  (this->defaultPose).c2 = (fVar29 + fVar29) * fVar26;
  (this->defaultPose).c3 = (1.0 - (fVar37 + fVar37)) * fVar26;
  (this->defaultPose).c4 = fVar27;
  (this->defaultPose).d1 = 0.0;
  (this->defaultPose).d2 = 0.0;
  (this->defaultPose).d3 = 0.0;
  (this->defaultPose).d4 = 1.0;
  puVar24 = (this->children).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
            _M_impl.super__Vector_impl_data._M_start;
  puVar20 = (this->children).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar24 == puVar20) {
      return;
    }
    for (ppBVar22 = (skeleton->bones).
                    super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        ppBVar22 !=
        (skeleton->bones).
        super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppBVar22 = ppBVar22 + 1) {
      pBVar23 = *ppBVar22;
      if (pBVar23->id == *puVar24) goto LAB_0047726d;
    }
    pBVar23 = (Bone *)0x0;
LAB_0047726d:
    if (pBVar23 == (Bone *)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "CalculateWorldMatrixAndDefaultPose: Failed to find child bone ",0x3e);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," for parent ",0xc);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,local_1c8);
      *(undefined ***)this_00 = &PTR__runtime_error_008e3168;
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    CalculateWorldMatrixAndDefaultPose(pBVar23,skeleton);
    puVar24 = puVar24 + 1;
  } while( true );
}

Assistant:

void Bone::CalculateWorldMatrixAndDefaultPose(Skeleton *skeleton)
{
    if (!IsParented())
        worldMatrix = aiMatrix4x4(scale, rotation, position).Inverse();
    else
        worldMatrix = aiMatrix4x4(scale, rotation, position).Inverse() * parent->worldMatrix;

    defaultPose = aiMatrix4x4(scale, rotation, position);

    // Recursively for all children now that the parent matrix has been calculated.
    for (auto boneId : children)
    {
        Bone *child = skeleton->BoneById(boneId);
        if (!child) {
            throw DeadlyImportError(Formatter::format() << "CalculateWorldMatrixAndDefaultPose: Failed to find child bone " << boneId << " for parent " << id << " " << name);
        }
        child->CalculateWorldMatrixAndDefaultPose(skeleton);
    }
}